

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_sim.c
# Opt level: O0

int cvNlsLSolveSensSim(N_Vector deltaSim,void *cvode_mem)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  undefined8 *in_RDI;
  N_Vector *deltaS;
  N_Vector delta;
  int is;
  int retval;
  CVodeMem cv_mem;
  int local_28;
  int local_4;
  
  if (in_RSI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x157,"cvNlsLSolveSensSim",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar2 = (**(code **)(in_RSI + 2000))
                      (in_RSI,**(undefined8 **)*in_RDI,*(undefined8 *)(in_RSI + 0x1b8),
                       *(undefined8 *)(in_RSI + 0x1c0),*(undefined8 *)(in_RSI + 0x1d8));
    if (iVar2 < 0) {
      local_4 = -7;
    }
    else if (iVar2 < 1) {
      lVar1 = *(long *)*in_RDI;
      for (local_28 = 0; local_28 < *(int *)(in_RSI + 0x90); local_28 = local_28 + 1) {
        iVar2 = (**(code **)(in_RSI + 2000))
                          (in_RSI,*(undefined8 *)(lVar1 + 8 + (long)local_28 * 8),
                           *(undefined8 *)(*(long *)(in_RSI + 0x2f0) + (long)local_28 * 8),
                           *(undefined8 *)(in_RSI + 0x1c0),*(undefined8 *)(in_RSI + 0x1d8));
        if (iVar2 < 0) {
          return -7;
        }
        if (0 < iVar2) {
          return 0x386;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 0x386;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsLSolveSensSim(N_Vector deltaSim, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;
  N_Vector delta;
  N_Vector* deltaS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract state delta from the vector wrapper */
  delta = NV_VEC_SW(deltaSim, 0);

  /* solve the state linear system */
  retval = cv_mem->cv_lsolve(cv_mem, delta, cv_mem->cv_ewt, cv_mem->cv_y,
                             cv_mem->cv_ftemp);

  if (retval < 0) { return (CV_LSOLVE_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  /* extract sensitivity deltas from the vector wrapper */
  deltaS = NV_VECS_SW(deltaSim) + 1;

  /* solve the sensitivity linear systems */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    retval = cv_mem->cv_lsolve(cv_mem, deltaS[is], cv_mem->cv_ewtS[is],
                               cv_mem->cv_y, cv_mem->cv_ftemp);

    if (retval < 0) { return (CV_LSOLVE_FAIL); }
    if (retval > 0) { return (SUN_NLS_CONV_RECVR); }
  }

  return (CV_SUCCESS);
}